

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.hpp
# Opt level: O0

void __thiscall
curlpp::CallbackException<curlpp::UnknowException>::~CallbackException
          (CallbackException<curlpp::UnknowException> *this)

{
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__CallbackException_00162ce8;
  UnknowException::~UnknowException((UnknowException *)0x14efba);
  CallbackExceptionBase::~CallbackExceptionBase((CallbackExceptionBase *)0x14efc4);
  return;
}

Assistant:

class CURLPPAPI CallbackException : public CallbackExceptionBase
	{

	public: 

		typedef CallbackException<ExceptionType> _CE;

		CallbackException(const ExceptionType & e) 
			: mException(e)
		{}

		virtual void throwMe() 
		{
			throw mException;
		}

		virtual _CE * clone() 
		{
			return new _CE(*this);
		}

	private:

		ExceptionType mException;

	}